

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O1

int dw_read_str_index_val_itself
              (Dwarf_Debug dbg,uint theform,Dwarf_Small *info_ptr,Dwarf_Small *section_end,
              Dwarf_Unsigned *return_index,Dwarf_Error *error)

{
  int iVar1;
  unsigned_long uVar2;
  Dwarf_Small *pDVar3;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned local_40;
  Dwarf_Unsigned local_38;
  
  switch(theform) {
  case 0x25:
    pDVar3 = info_ptr + 1;
    if (section_end < pDVar3) break;
    uVar2 = 1;
LAB_0015d4da:
    local_40 = 0;
    (*dbg->de_copy_word)(&local_40,info_ptr,uVar2);
    local_38 = local_40;
    goto LAB_0015d4eb;
  case 0x26:
    pDVar3 = info_ptr + 2;
    if (pDVar3 <= section_end) {
      uVar2 = 2;
      goto LAB_0015d4da;
    }
    break;
  case 0x27:
    pDVar3 = info_ptr + 3;
    if (pDVar3 <= section_end) {
      uVar2 = 3;
      goto LAB_0015d4da;
    }
    break;
  case 0x28:
    pDVar3 = info_ptr + 4;
    if (pDVar3 <= section_end) {
      uVar2 = 4;
      goto LAB_0015d4da;
    }
    break;
  default:
    if ((theform != 0x1f02) && (theform != 0x1a)) {
      _dwarf_error(dbg,error,0x103);
      return 1;
    }
    local_40 = 0;
    local_38 = 0;
    iVar1 = dwarf_decode_leb128((char *)info_ptr,&local_40,&local_38,(char *)section_end);
    if (iVar1 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
      return 1;
    }
    goto LAB_0015d4f5;
  }
  local_40 = 0;
  _dwarf_error_string(dbg,error,0x14b,
                      "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
  local_38 = 0;
LAB_0015d4eb:
  iVar1 = 1;
  if (pDVar3 <= section_end) {
LAB_0015d4f5:
    *return_index = local_38;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
dw_read_str_index_val_itself(Dwarf_Debug dbg,
    unsigned theform,
    Dwarf_Small *info_ptr,
    Dwarf_Small *section_end,
    Dwarf_Unsigned *return_index,
    Dwarf_Error *error)
{
    Dwarf_Unsigned index = 0;

    switch(theform) {
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
        DECODE_LEB128_UWORD_CK(info_ptr,index,
            dbg,error,section_end);
        break;
    case DW_FORM_strx1:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 1,
            error,section_end);
        break;
    case DW_FORM_strx2:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 2,
            error,section_end);
        break;
    case DW_FORM_strx3:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 3,
            error,section_end);
        break;
    case DW_FORM_strx4:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 4,
            error,section_end);
        break;
    default:
        _dwarf_error(dbg, error, DW_DLE_ATTR_FORM_NOT_STR_INDEX);
        return DW_DLV_ERROR;
    }
    *return_index = index;
    return DW_DLV_OK;
}